

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryReader::readImports(WasmBinaryReader *this)

{
  pointer puVar1;
  pointer puVar2;
  iterator __position;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  HeapType HVar11;
  _Alloc_hider _Var12;
  size_type sVar13;
  uint32_t uVar14;
  int32_t code;
  HeapTypeKind HVar15;
  Type TVar16;
  long *plVar17;
  size_type *psVar18;
  ulong uVar19;
  ulong uVar20;
  string_view sVar21;
  string_view sVar22;
  Name NVar23;
  Signature sig;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  size_t *usedNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedFunctionNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedTableNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedMemoryNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedGlobalNames;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedTagNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  string local_200;
  string local_1e0;
  pair<wasm::Name,_bool> local_1c0;
  undefined1 local_1a8 [8];
  bool is_shared;
  HeapType local_188;
  ulong local_180;
  wasm *local_178;
  wasm *local_170;
  wasm *local_168;
  wasm *local_160;
  wasm *local_158;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_150;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  HeapType local_a8;
  HeapType type;
  _Head_base<0UL,_wasm::Tag_*,_false> local_98;
  __single_object tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  uVar14 = getU32LEB(this);
  usedNames = &usedFunctionNames._M_h._M_rehash_policy._M_next_resize;
  usedFunctionNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedFunctionNames._M_h._M_bucket_count = 0;
  usedFunctionNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedFunctionNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedFunctionNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedFunctionNames._M_h._M_rehash_policy._4_4_ = 0;
  usedFunctionNames._M_h._M_rehash_policy._M_next_resize = 0;
  usedFunctionNames._M_h._M_single_bucket =
       (__node_base_ptr)&usedTableNames._M_h._M_rehash_policy._M_next_resize;
  usedTableNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedTableNames._M_h._M_bucket_count = 0;
  usedTableNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedTableNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedTableNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedTableNames._M_h._M_rehash_policy._4_4_ = 0;
  usedTableNames._M_h._M_rehash_policy._M_next_resize = 0;
  usedTableNames._M_h._M_single_bucket =
       (__node_base_ptr)&usedMemoryNames._M_h._M_rehash_policy._M_next_resize;
  usedMemoryNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedMemoryNames._M_h._M_bucket_count = 0;
  usedMemoryNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedMemoryNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedMemoryNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedMemoryNames._M_h._M_rehash_policy._4_4_ = 0;
  usedMemoryNames._M_h._M_rehash_policy._M_next_resize = 0;
  usedMemoryNames._M_h._M_single_bucket =
       (__node_base_ptr)&usedGlobalNames._M_h._M_rehash_policy._M_next_resize;
  usedGlobalNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedGlobalNames._M_h._M_bucket_count = 0;
  usedGlobalNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedGlobalNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedGlobalNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedGlobalNames._M_h._M_rehash_policy._4_4_ = 0;
  usedGlobalNames._M_h._M_rehash_policy._M_next_resize = 0;
  usedGlobalNames._M_h._M_single_bucket =
       (__node_base_ptr)&usedTagNames._M_h._M_rehash_policy._M_next_resize;
  usedTagNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedTagNames._M_h._M_bucket_count = 0;
  usedTagNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedTagNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedTagNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedTagNames._M_h._M_rehash_policy._4_4_ = 0;
  usedTagNames._M_h._M_rehash_policy._M_next_resize = 0;
  if (uVar14 != 0) {
    uVar20 = (ulong)uVar14;
    local_178 = (wasm *)&this->tagNames;
    local_170 = (wasm *)&this->globalNames;
    local_168 = (wasm *)&this->memoryNames;
    local_160 = (wasm *)&this->tableNames;
    local_158 = (wasm *)&this->functionNames;
    local_150 = &this->functionTypes;
    type.id = (uintptr_t)this;
    do {
      sVar21 = (string_view)getInlineString(this,true);
      sVar22 = (string_view)getInlineString(this,true);
      uVar14 = getU32LEB(this);
      switch(uVar14) {
      case 0:
        puVar1 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar2 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"fimport$","");
        NVar23 = makeName(&local_148,
                          (long)(this->wasm->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->wasm->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
        name.super_IString.str._M_str = &stack0xfffffffffffffc08;
        name.super_IString.str._M_len = (size_t)NVar23.super_IString.str._M_str;
        getOrMakeName(&local_1c0,local_158,
                      (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                       *)((ulong)((long)puVar1 - (long)puVar2) >> 3 & 0xffffffff),
                      (Index)NVar23.super_IString.str._M_len,name,
                      (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)usedNames);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        uVar14 = getU32LEB(this);
        local_58._M_dataplus._M_p = (pointer)getTypeByIndex(this,uVar14);
        __position._M_current =
             (this->functionTypes).
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->functionTypes).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>(local_150,__position,(HeapType *)&local_58);
        }
        else {
          (__position._M_current)->id = (uintptr_t)local_58._M_dataplus._M_p;
          (this->functionTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        local_a8 = getTypeByIndex(this,uVar14);
        HVar15 = HeapType::getKind(&local_a8);
        if (HVar15 != Func) {
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_280,"Imported function ","");
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_260,sVar21._M_str,sVar21._M_str + sVar21._M_len);
          std::operator+(&local_2c0,&local_280,&local_260);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,&local_2c0,'.');
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_240,sVar22._M_str,sVar22._M_str + sVar22._M_len);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffffff68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,&local_240);
          plVar17 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff68);
          local_58._M_dataplus._M_p = (pointer)*plVar17;
          psVar18 = (size_type *)(plVar17 + 2);
          if ((size_type *)local_58._M_dataplus._M_p == psVar18) {
            local_58.field_2._M_allocated_capacity = *psVar18;
            local_58.field_2._8_8_ = plVar17[3];
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          }
          else {
            local_58.field_2._M_allocated_capacity = *psVar18;
          }
          local_58._M_string_length = plVar17[1];
          *plVar17 = (long)psVar18;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          HeapType::toString_abi_cxx11_(&local_2a0,&local_a8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &usedTagNames._M_h._M_single_bucket,&local_58,&local_2a0);
          throwError(this,(string *)&usedTagNames._M_h._M_single_bucket);
        }
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0;
        NVar23.super_IString.str._M_str = (char *)local_1c0.first.super_IString.str._M_len;
        NVar23.super_IString.str._M_len = (size_t)&stack0xffffffffffffff68;
        Builder::makeFunction
                  (NVar23,(HeapType)local_1c0.first.super_IString.str._M_str,
                   (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_a8.id,
                   (Expression *)&local_58);
        if (local_58._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_58._M_dataplus._M_p,
                          local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
        }
        ((local_98._M_head_impl)->super_Importable).super_Named.hasExplicitName = local_1c0.second;
        ((local_98._M_head_impl)->super_Importable).module.super_IString.str = sVar21;
        ((local_98._M_head_impl)->super_Importable).base.super_IString.str = sVar22;
        setLocalNames(this,(Function *)local_98._M_head_impl,
                      (Index)((ulong)((long)(this->wasm->functions).
                                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->wasm->functions).
                                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3));
        Module::addFunction(this->wasm,
                            (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                            &stack0xffffffffffffff68);
        if ((Function *)local_98._M_head_impl != (Function *)0x0) {
          std::default_delete<wasm::Function>::operator()
                    ((default_delete<wasm::Function> *)&stack0xffffffffffffff68,
                     (Function *)local_98._M_head_impl);
        }
        break;
      case 1:
        puVar9 = (this->wasm->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar10 = (this->wasm->tables).
                  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"timport$","");
        NVar23 = makeName(&local_128,
                          (long)(this->wasm->tables).
                                super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->wasm->tables).
                                super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
        name_03.super_IString.str._M_str = (char *)&usedFunctionNames._M_h._M_single_bucket;
        name_03.super_IString.str._M_len = (size_t)NVar23.super_IString.str._M_str;
        getOrMakeName((pair<wasm::Name,_bool> *)&local_58,local_160,
                      (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                       *)((ulong)((long)puVar9 - (long)puVar10) >> 3 & 0xffffffff),
                      (Index)NVar23.super_IString.str._M_len,name_03,
                      (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)usedNames);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        sVar13 = local_58._M_string_length;
        _Var12._M_p = local_58._M_dataplus._M_p;
        local_98._M_head_impl = (Tag *)operator_new(0x58);
        *(undefined8 *)((long)local_98._M_head_impl + 0x10) = 0;
        *(pointer *)local_98._M_head_impl = _Var12._M_p;
        *(size_type *)((long)local_98._M_head_impl + 8) = sVar13;
        *(pointer *)((long)local_98._M_head_impl + 0x50) = (pointer)0x12;
        (((vector<wasm::Type,_std::allocator<wasm::Type>_> *)((long)local_98._M_head_impl + 0x48))->
        super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x2;
        ((HeapType *)((long)local_98._M_head_impl + 0x38))->id = 0;
        *(undefined8 *)((long)local_98._M_head_impl + 0x40) = 0xffffffff;
        *(char *)((long)local_98._M_head_impl + 0x10) = local_58.field_2._M_local_buf[0];
        *(string_view *)((long)local_98._M_head_impl + 0x18) = sVar21;
        *(string_view *)((long)local_98._M_head_impl + 0x28) = sVar22;
        code = getS32LEB(this);
        TVar16 = getType(this,code);
        *(uintptr_t *)((long)local_98._M_head_impl + 0x50) = TVar16.id;
        getResizableLimits(this,(Address *)((long)local_98._M_head_impl + 0x38),
                           (Address *)((long)local_98._M_head_impl + 0x40),(bool *)local_1a8,
                           (Type *)((long)local_98._M_head_impl + 0x48),(Address)0xffffffff);
        if ((bool)local_1a8[0] == true) {
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_220,"Tables may not be shared","");
          throwError(this,&local_220);
        }
        Module::addTable(this->wasm,
                         (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                         &stack0xffffffffffffff68);
        goto joined_r0x00c67eb0;
      case 2:
        puVar5 = (this->wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar6 = (this->wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"mimport$","");
        NVar23 = makeName(&local_108,
                          (long)(this->wasm->memories).
                                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->wasm->memories).
                                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
        name_01.super_IString.str._M_str = (char *)&usedTableNames._M_h._M_single_bucket;
        name_01.super_IString.str._M_len = (size_t)NVar23.super_IString.str._M_str;
        getOrMakeName((pair<wasm::Name,_bool> *)&local_58,local_168,
                      (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                       *)((ulong)((long)puVar5 - (long)puVar6) >> 3 & 0xffffffff),
                      (Index)NVar23.super_IString.str._M_len,name_01,
                      (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)usedNames);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        sVar13 = local_58._M_string_length;
        _Var12._M_p = local_58._M_dataplus._M_p;
        local_98._M_head_impl = (Tag *)operator_new(0x58);
        *(undefined8 *)((long)local_98._M_head_impl + 0x40) = 0;
        (((vector<wasm::Type,_std::allocator<wasm::Type>_> *)((long)local_98._M_head_impl + 0x48))->
        super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        *(char **)((long)local_98._M_head_impl + 0x30) = (char *)0x0;
        ((HeapType *)((long)local_98._M_head_impl + 0x38))->id = 0;
        *(char **)((long)local_98._M_head_impl + 0x20) = (char *)0x0;
        (((Name *)((long)local_98._M_head_impl + 0x28))->super_IString).str._M_len = 0;
        *(undefined8 *)((long)local_98._M_head_impl + 0x10) = 0;
        (((Name *)((long)local_98._M_head_impl + 0x18))->super_IString).str._M_len = 0;
        *(pointer *)local_98._M_head_impl = _Var12._M_p;
        *(size_type *)((long)local_98._M_head_impl + 8) = sVar13;
        *(undefined8 *)((long)local_98._M_head_impl + 0x40) = 0x10000;
        *(pointer *)((long)local_98._M_head_impl + 0x50) = (pointer)0x2;
        *(char *)((long)local_98._M_head_impl + 0x10) = local_58.field_2._M_local_buf[0];
        (((Name *)((long)local_98._M_head_impl + 0x18))->super_IString).str = sVar21;
        (((Name *)((long)local_98._M_head_impl + 0x28))->super_IString).str = sVar22;
        getResizableLimits(this,(Address *)((long)local_98._M_head_impl + 0x38),
                           (Address *)((long)local_98._M_head_impl + 0x40),
                           (bool *)((long)local_98._M_head_impl + 0x48),
                           (Type *)((long)local_98._M_head_impl + 0x50),(Address)0xffffffffffffffff)
        ;
        Module::addMemory(this->wasm,
                          (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                          &stack0xffffffffffffff68);
joined_r0x00c67eb0:
        if (local_98._M_head_impl != (Tag *)0x0) {
          uVar19 = 0x58;
LAB_00c6819d:
          operator_delete(local_98._M_head_impl,uVar19);
        }
        break;
      case 3:
        puVar7 = (this->wasm->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar8 = (this->wasm->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"gimport$","");
        NVar23 = makeName(&local_e8,
                          (long)(this->wasm->globals).
                                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->wasm->globals).
                                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
        name_02.super_IString.str._M_str = (char *)&usedMemoryNames._M_h._M_single_bucket;
        name_02.super_IString.str._M_len = (size_t)NVar23.super_IString.str._M_str;
        getOrMakeName((pair<wasm::Name,_bool> *)&local_58,local_170,
                      (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                       *)((ulong)((long)puVar7 - (long)puVar8) >> 3 & 0xffffffff),
                      (Index)NVar23.super_IString.str._M_len,name_02,
                      (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)usedNames);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        TVar16 = getConcreteType(this);
        uVar14 = getU32LEB(this);
        sVar13 = local_58._M_string_length;
        _Var12._M_p = local_58._M_dataplus._M_p;
        local_180 = uVar20;
        if (1 < uVar14) {
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_200,"Global mutability must be 0 or 1","");
          throwError((WasmBinaryReader *)type.id,&local_200);
        }
        local_98._M_head_impl = (Tag *)operator_new(0x50);
        *(undefined8 *)((long)local_98._M_head_impl + 0x40) = 0;
        (((vector<wasm::Type,_std::allocator<wasm::Type>_> *)((long)local_98._M_head_impl + 0x48))->
        super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        *(char **)((long)local_98._M_head_impl + 0x30) = (char *)0x0;
        ((HeapType *)((long)local_98._M_head_impl + 0x38))->id = 0;
        *(char **)((long)local_98._M_head_impl + 0x20) = (char *)0x0;
        (((Name *)((long)local_98._M_head_impl + 0x28))->super_IString).str._M_len = 0;
        *(undefined8 *)((long)local_98._M_head_impl + 0x10) = 0;
        (((Name *)((long)local_98._M_head_impl + 0x18))->super_IString).str._M_len = 0;
        *(pointer *)local_98._M_head_impl = _Var12._M_p;
        *(size_type *)((long)local_98._M_head_impl + 8) = sVar13;
        ((HeapType *)((long)local_98._M_head_impl + 0x38))->id = TVar16.id;
        *(bool *)&(((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                   ((long)local_98._M_head_impl + 0x48))->
                  super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                  super__Vector_impl_data._M_start = uVar14 == 1;
        *(char *)((long)local_98._M_head_impl + 0x10) = local_58.field_2._M_local_buf[0];
        (((Name *)((long)local_98._M_head_impl + 0x18))->super_IString).str = sVar21;
        (((Name *)((long)local_98._M_head_impl + 0x28))->super_IString).str = sVar22;
        Module::addGlobal(*(Module **)type.id,
                          (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                          &stack0xffffffffffffff68);
        uVar20 = local_180;
        this = (WasmBinaryReader *)type;
        if ((_Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>)local_98._M_head_impl !=
            (Tag *)0x0) {
          operator_delete(local_98._M_head_impl,0x50);
          this = (WasmBinaryReader *)type;
        }
        break;
      case 4:
        puVar3 = (this->wasm->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar4 = (this->wasm->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"eimport$","");
        NVar23 = makeName(&local_c8,
                          (long)(this->wasm->tags).
                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->wasm->tags).
                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
        name_00.super_IString.str._M_str = (char *)&usedGlobalNames._M_h._M_single_bucket;
        name_00.super_IString.str._M_len = (size_t)NVar23.super_IString.str._M_str;
        getOrMakeName((pair<wasm::Name,_bool> *)&local_58,local_178,
                      (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                       *)((ulong)((long)puVar3 - (long)puVar4) >> 3 & 0xffffffff),
                      (Index)NVar23.super_IString.str._M_len,name_00,
                      (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)usedNames);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        getInt8(this);
        uVar14 = getU32LEB(this);
        sVar13 = local_58._M_string_length;
        _Var12._M_p = local_58._M_dataplus._M_p;
        sig = getSignatureByTypeIndex(this,uVar14);
        HeapType::HeapType(&local_188,sig);
        HVar11.id = local_188.id;
        local_98._M_head_impl = (Tag *)operator_new(0x40);
        *(undefined8 *)((long)local_98._M_head_impl + 0x10) = 0;
        *(pointer *)local_98._M_head_impl = _Var12._M_p;
        *(size_type *)((long)local_98._M_head_impl + 8) = sVar13;
        ((HeapType *)((long)local_98._M_head_impl + 0x38))->id = HVar11.id;
        *(char *)((long)local_98._M_head_impl + 0x10) = local_58.field_2._M_local_buf[0];
        (((Name *)((long)local_98._M_head_impl + 0x18))->super_IString).str = sVar21;
        (((Name *)((long)local_98._M_head_impl + 0x28))->super_IString).str = sVar22;
        Module::addTag(this->wasm,
                       (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)
                       &stack0xffffffffffffff68);
        if ((__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)local_98._M_head_impl ==
            (__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)0x0) break;
        uVar19 = 0x40;
        goto LAB_00c6819d;
      default:
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"bad import kind","");
        throwError(this,&local_1e0);
      }
      uVar20 = uVar20 - 1;
    } while (uVar20 != 0);
  }
  this->numFuncImports =
       (Index)((ulong)((long)(this->wasm->functions).
                             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->wasm->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&usedGlobalNames._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&usedMemoryNames._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&usedTableNames._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&usedFunctionNames._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&stack0xfffffffffffffc08);
  return;
}

Assistant:

void WasmBinaryReader::readImports() {
  size_t num = getU32LEB();
  Builder builder(wasm);
  std::unordered_set<Name> usedFunctionNames, usedTableNames, usedMemoryNames,
    usedGlobalNames, usedTagNames;
  for (size_t i = 0; i < num; i++) {
    auto module = getInlineString();
    auto base = getInlineString();
    auto kind = (ExternalKind)getU32LEB();
    // We set a unique prefix for the name based on the kind. This ensures no
    // collisions between them, which can't occur here (due to the index i) but
    // could occur later due to the names section.
    switch (kind) {
      case ExternalKind::Function: {
        auto [name, isExplicit] =
          getOrMakeName(functionNames,
                        wasm.functions.size(),
                        makeName("fimport$", wasm.functions.size()),
                        usedFunctionNames);
        auto index = getU32LEB();
        functionTypes.push_back(getTypeByIndex(index));
        auto type = getTypeByIndex(index);
        if (!type.isSignature()) {
          throwError(std::string("Imported function ") + module.toString() +
                     '.' + base.toString() +
                     "'s type must be a signature. Given: " + type.toString());
        }
        auto curr = builder.makeFunction(name, type, {});
        curr->hasExplicitName = isExplicit;
        curr->module = module;
        curr->base = base;
        setLocalNames(*curr, wasm.functions.size());
        wasm.addFunction(std::move(curr));
        break;
      }
      case ExternalKind::Table: {
        auto [name, isExplicit] =
          getOrMakeName(tableNames,
                        wasm.tables.size(),
                        makeName("timport$", wasm.tables.size()),
                        usedTableNames);
        auto table = builder.makeTable(name);
        table->hasExplicitName = isExplicit;
        table->module = module;
        table->base = base;
        table->type = getType();

        bool is_shared;
        getResizableLimits(table->initial,
                           table->max,
                           is_shared,
                           table->addressType,
                           Table::kUnlimitedSize);
        if (is_shared) {
          throwError("Tables may not be shared");
        }
        wasm.addTable(std::move(table));
        break;
      }
      case ExternalKind::Memory: {
        auto [name, isExplicit] =
          getOrMakeName(memoryNames,
                        wasm.memories.size(),
                        makeName("mimport$", wasm.memories.size()),
                        usedMemoryNames);
        auto memory = builder.makeMemory(name);
        memory->hasExplicitName = isExplicit;
        memory->module = module;
        memory->base = base;
        getResizableLimits(memory->initial,
                           memory->max,
                           memory->shared,
                           memory->addressType,
                           Memory::kUnlimitedSize);
        wasm.addMemory(std::move(memory));
        break;
      }
      case ExternalKind::Global: {
        auto [name, isExplicit] =
          getOrMakeName(globalNames,
                        wasm.globals.size(),
                        makeName("gimport$", wasm.globals.size()),
                        usedGlobalNames);
        auto type = getConcreteType();
        auto mutable_ = getU32LEB();
        if (mutable_ & ~1) {
          throwError("Global mutability must be 0 or 1");
        }
        auto curr =
          builder.makeGlobal(name,
                             type,
                             nullptr,
                             mutable_ ? Builder::Mutable : Builder::Immutable);
        curr->hasExplicitName = isExplicit;
        curr->module = module;
        curr->base = base;
        wasm.addGlobal(std::move(curr));
        break;
      }
      case ExternalKind::Tag: {
        auto [name, isExplicit] =
          getOrMakeName(tagNames,
                        wasm.tags.size(),
                        makeName("eimport$", wasm.tags.size()),
                        usedTagNames);
        getInt8(); // Reserved 'attribute' field
        auto index = getU32LEB();
        auto curr = builder.makeTag(name, getSignatureByTypeIndex(index));
        curr->hasExplicitName = isExplicit;
        curr->module = module;
        curr->base = base;
        wasm.addTag(std::move(curr));
        break;
      }
      default: {
        throwError("bad import kind");
      }
    }
  }
  numFuncImports = wasm.functions.size();
}